

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstruct<float>_>::MultAdd
          (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *y,TPZFMatrix<float> *z,float alpha,float beta,int opt)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *this_00;
  void *pvVar4;
  size_type sVar5;
  int64_t iVar6;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<float> *in_RSI;
  TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *in_RDI;
  int in_R8D;
  TPZFMatrix<float> *in_stack_00000010;
  TPZFMatrix<float> *in_stack_00000018;
  TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *in_stack_00000020;
  TPZFMatrix<float> *in_stack_000000b0;
  TPZFMatrix<float> *in_stack_000000b8;
  TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *in_stack_000000c0;
  int64_t ic;
  int64_t xcols;
  int i;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> data;
  TPZFMatrix<float> *Residual_local;
  int isub;
  const_iterator it;
  TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_> v2work;
  TPZAutoPointer<TPZDohrAssembleList<float>_> assemblelist;
  TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstruct<float>_> v1threaddata;
  vector<std::thread,_std::allocator<std::thread>_> AllThreads;
  TPZFMatrix<float> v2;
  TPZFMatrix<float> v1;
  int64_t c;
  int64_t cols;
  int64_t rows;
  TPZSimpleTimer precondi;
  list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
  *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  float fVar7;
  float *in_stack_fffffffffffffc18;
  TPZSimpleTimer *in_stack_fffffffffffffc20;
  TPZDohrAssembleList<float> *in_stack_fffffffffffffc28;
  TPZDohrAssembleList<float> *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc3c;
  TPZFMatrix<float> *in_stack_fffffffffffffc40;
  TPZDohrAssembly<float> *in_stack_fffffffffffffc48;
  TPZFMatrix<float> *in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc5c;
  TPZDohrAssembleList<float> *in_stack_fffffffffffffc60;
  TPZFMatrix<float> *in_stack_fffffffffffffc68;
  TPZFMatrix<float> *in_stack_fffffffffffffc70;
  long local_318;
  int local_2e4;
  _Self local_2b0;
  _List_node_base *local_2a8;
  int local_29c;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<float>_>_> local_298 [10];
  undefined1 local_241;
  TPZAutoPointer<TPZDohrAssembleList<float>_> local_238;
  TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstruct<float>_> *local_230;
  TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstruct<float>_> local_220;
  undefined8 in_stack_fffffffffffffe08;
  pointer in_stack_fffffffffffffe10;
  TPZSimpleTimer *in_stack_ffffffffffffff10;
  long local_b8;
  
  if (in_R8D == 0) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 == iVar3) goto LAB_01f7322d;
LAB_01f7325f:
    TPZMatrix<float>::Error((char *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
  }
  else {
LAB_01f7322d:
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) goto LAB_01f7325f;
  }
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    iVar3 = TPZBaseMatrix::Cols(in_RCX);
    if (iVar2 == iVar3) {
      iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
      iVar3 = TPZBaseMatrix::Rows(in_RDX);
      if (iVar2 == iVar3) {
        iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
        iVar3 = TPZBaseMatrix::Rows(in_RCX);
        if (iVar2 == iVar3) goto LAB_01f7334b;
      }
    }
  }
  TPZMatrix<float>::Error((char *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
LAB_01f7334b:
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)in_stack_fffffffffffffc30);
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  TPZMatrix<float>::PrepareZ
            (&in_stack_fffffffffffffc70->super_TPZMatrix<float>,in_stack_fffffffffffffc68,
             (TPZFMatrix<float> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
             in_stack_fffffffffffffc58);
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
             (int64_t)in_stack_fffffffffffffc60,
             (float *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
             (int64_t)in_stack_fffffffffffffc60,
             (float *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  if (in_RDI->fNumThreads < 1) {
    ComputeV1(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    ComputeV2(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  else {
    this_00 = (TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *)
              (long)(in_RDI->fNumThreads + 2);
    std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1f73548);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc30,
               (size_type)in_stack_fffffffffffffc28,(allocator_type *)in_stack_fffffffffffffc20);
    std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1f7356e);
    TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstruct<float>_>::TPZDohrPrecondThreadV1Data
              (&local_220,in_RDI,in_RSI,(TPZFMatrix<float> *)&stack0xfffffffffffffeb8);
    local_230 = &local_220;
    std::thread::
    thread<void*(&)(void*),TPZDohrPrecondThreadV1Data<float,TPZDohrSubstruct<float>>*,void>
              ((thread *)in_stack_fffffffffffffc50,
               (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc48,
               (TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstruct<float>_> **)
               in_stack_fffffffffffffc40);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffe00,0);
    in_stack_fffffffffffffc60 = (TPZDohrAssembleList<float> *)&stack0xfffffffffffffdd8;
    std::thread::operator=
              ((thread *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (thread *)in_stack_fffffffffffffc08);
    std::thread::~thread((thread *)0x1f735f3);
    pvVar4 = operator_new(0xe0);
    local_241 = 1;
    sVar5 = std::__cxx11::
            list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
            ::size((list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    in_stack_fffffffffffffc5c = (float)sVar5;
    TPZAutoPointer<TPZDohrAssembly<float>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffc08);
    TPZDohrAssembleList<float>::TPZDohrAssembleList
              (in_stack_fffffffffffffc60,(int)in_stack_fffffffffffffc5c,in_stack_fffffffffffffc50,
               (TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffc48);
    local_241 = 0;
    TPZAutoPointer<TPZDohrAssembleList<float>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<float>_> *)in_stack_fffffffffffffc30,
               in_stack_fffffffffffffc28);
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_>::TPZDohrPrecondV2SubDataList
              ((TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_> *)
               in_stack_fffffffffffffc30,
               (TPZAutoPointer<TPZDohrAssembleList<float>_> *)in_stack_fffffffffffffc28);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>::_List_const_iterator
              (local_298);
    local_29c = 0;
    local_2a8 = (_List_node_base *)
                std::__cxx11::
                list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
                ::begin(in_stack_fffffffffffffc08);
    local_298[0]._M_node = local_2a8;
    while( true ) {
      local_2b0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
           ::end(in_stack_fffffffffffffc08);
      bVar1 = std::operator!=(local_298,&local_2b0);
      if (!bVar1) break;
      in_stack_fffffffffffffc50 = (TPZFMatrix<float> *)operator_new(0x90);
      TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffffc40);
      in_stack_fffffffffffffc48 =
           TPZAutoPointer<TPZDohrAssembly<float>_>::operator->(&in_RDI->fAssemble);
      TPZDohrAssembly<float>::Extract
                ((TPZDohrAssembly<float> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
                 (TPZFMatrix<float> *)in_stack_fffffffffffffc30,
                 (TPZFMatrix<float> *)in_stack_fffffffffffffc28);
      in_stack_fffffffffffffc3c = local_29c;
      in_stack_fffffffffffffc40 =
           (TPZFMatrix<float> *)
           std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>::operator*
                     ((_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<float>_>_> *)
                      CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      TPZAutoPointer<TPZFMatrix<float>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZFMatrix<float>_> *)in_stack_fffffffffffffc30,
                 (TPZFMatrix<float> *)in_stack_fffffffffffffc28);
      TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>::TPZDohrPrecondV2SubData
                (this_00,(int)((ulong)pvVar4 >> 0x20),
                 (TPZAutoPointer<TPZDohrSubstruct<float>_> *)in_stack_fffffffffffffc60,
                 (TPZAutoPointer<TPZFMatrix<float>_> *)
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      TPZAutoPointer<TPZFMatrix<float>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZFMatrix<float>_> *)
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_>::AddItem
                ((TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_> *)
                 in_stack_fffffffffffffc30,
                 (TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *)
                 in_stack_fffffffffffffc28);
      TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>::~TPZDohrPrecondV2SubData
                ((TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *)
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>::operator++(local_298,0);
      local_29c = local_29c + 1;
    }
    for (local_2e4 = 0; local_2e4 < in_RDI->fNumThreads; local_2e4 = local_2e4 + 1) {
      std::thread::
      thread<void*(&)(void*),TPZDohrPrecondV2SubDataList<float,TPZDohrSubstruct<float>>*,void>
                ((thread *)in_stack_fffffffffffffc50,
                 (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc48,
                 (TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_> **)
                 in_stack_fffffffffffffc40);
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffe00,
                 (long)(local_2e4 + 2));
      std::thread::operator=
                ((thread *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (thread *)in_stack_fffffffffffffc08);
      std::thread::~thread((thread *)0x1f739eb);
    }
    in_stack_fffffffffffffc30 = TPZAutoPointer<TPZDohrAssembleList<float>_>::operator->(&local_238);
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<float>*,void>
              ((thread *)in_stack_fffffffffffffc50,
               (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc48,
               (TPZDohrAssembleList<float> **)in_stack_fffffffffffffc40);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffe00,1);
    std::thread::operator=
              ((thread *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (thread *)in_stack_fffffffffffffc08);
    std::thread::~thread((thread *)0x1f73a6f);
    for (local_2e4 = 0; local_2e4 < in_RDI->fNumThreads + 2; local_2e4 = local_2e4 + 1) {
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffe00,
                 (long)local_2e4);
      std::thread::join();
    }
    TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_>::~TPZDohrPrecondV2SubDataList
              ((TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    TPZAutoPointer<TPZDohrAssembleList<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<float>_> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc20);
  }
  TPZFMatrix<float>::operator+=
            ((TPZFMatrix<float> *)in_stack_fffffffffffffc60,
             (TPZMatrix<float> *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  iVar3 = iVar6;
  for (local_318 = 0; local_318 < iVar6; local_318 = local_318 + 1) {
    for (local_b8 = 0; local_b8 < iVar2; local_b8 = local_b8 + 1) {
      in_stack_fffffffffffffc20 =
           (TPZSimpleTimer *)
           TPZFMatrix<float>::operator()
                     ((TPZFMatrix<float> *)in_stack_fffffffffffffc30,iVar3,
                      (int64_t)in_stack_fffffffffffffc20);
      fVar7 = *(float *)&in_stack_fffffffffffffc20->fName;
      in_stack_fffffffffffffc18 =
           TPZFMatrix<float>::operator()
                     ((TPZFMatrix<float> *)in_stack_fffffffffffffc30,iVar3,
                      (int64_t)in_stack_fffffffffffffc20);
      *in_stack_fffffffffffffc18 = fVar7 + *in_stack_fffffffffffffc18;
    }
  }
  TPZSimpleTimer::ReturnTimeDouble(in_stack_fffffffffffffc20);
  TPZStack<double,_10>::Push
            ((TPZStack<double,_10> *)in_stack_fffffffffffffc20,(double)in_stack_fffffffffffffc18);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1f73c71);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1f73c7e);
  TPZSimpleTimer::~TPZSimpleTimer(in_stack_ffffffffffffff10);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
    
#ifdef USING_TBB
	MultAddTBB(x, y, z, alpha, beta, opt);
	return;
#endif
    
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	TPZSimpleTimer precondi; // init of timer
	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	int64_t c;
	this->PrepareZ(y,z,beta,opt);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		x.Print("x entry vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
	TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);
	if(fNumThreads <= 0)
	{
		ComputeV1(x,v1);
		ComputeV2(x,v2);
	}
	else
	{
        std::vector<std::thread> AllThreads(fNumThreads+2);
		TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
		
        AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1), &v1threaddata);
		
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
		
		TPZDohrPrecondV2SubDataList<TVar,TSubStruct> v2work(assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
		
		int isub=0;
		//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
		for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
		{
			TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
			fAssemble->Extract(isub,x,*Residual_local);
			TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
			v2work.AddItem(data);
		}
		
		int i;
		for (i=0; i<fNumThreads; i++) {
            AllThreads[i+2] = std::thread(TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork, &v2work);
		}
		//		v2work.ThreadWork(&v2work);
		AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                               assemblelist.operator->());
		
		for (i=0; i<fNumThreads+2; i++) {
            AllThreads[i].join();
		}
		//		ComputeV2(x,v2);
	}
	v2 += v1;
	
#ifndef MAKEINTERNAL
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		TPZFNMatrix<100> v2Expand((*it)->fNEquations,1,0.), v3Expand((*it)->fNEquations,1,0.);
		int64_t neqs = (*it)->fGlobalEqs.NElements();
		TPZFMatrix<TVar> v3_local(neqs,1,0.), v2_local(neqs,1,0.);
		fAssemble->Extract(isub,v2,v2_local);
		int64_t i;
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v2Expand(ind.first,0) += v2_local(i,0);
		}
		
		(*it)->Contribute_v3_local(v2Expand,v3Expand);
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v3_local(i,0) += v3Expand(ind.first,0);
		}
#ifdef PZ_LOG
		{
			std::stringstream sout;
			v2Expand.Print("v1+v2 Expand",sout);
			v3Expand.Print("v3 Expand", sout);
			v2_local.Print("v1+v2 local",sout);
			v3_local.Print("v3 local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		fAssemble->Assemble(isub,v3_local,v2);
	}
#endif
	// wait task para finalizacao da chamada
	// esperar a versao correta do v1
	/* Sum v1+v2+v3 with z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }
	tempo.fPreCond.Push(precondi.ReturnTimeDouble()); // end of timer
}